

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O3

void ASDCP::JP2K::PictureDescriptorDump(PictureDescriptor *PDesc,FILE *stream)

{
  ui16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  char cVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ui8_t *puVar10;
  uint uVar11;
  char tmp_buf [512];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  uVar8 = 0;
  fprintf((FILE *)stream,
          "       AspectRatio: %d/%d\n          EditRate: %d/%d\n        SampleRate: %d/%d\n       StoredWidth: %u\n      StoredHeight: %u\n             Rsize: %u\n             Xsize: %u\n             Ysize: %u\n            XOsize: %u\n            YOsize: %u\n            XTsize: %u\n            YTsize: %u\n           XTOsize: %u\n           YTOsize: %u\n ContainerDuration: %u\n"
          ,(ulong)(uint)(PDesc->AspectRatio).Numerator,(ulong)(uint)(PDesc->AspectRatio).Denominator
          ,(ulong)(uint)(PDesc->EditRate).Numerator,(ulong)(uint)(PDesc->EditRate).Denominator,
          (ulong)(uint)(PDesc->SampleRate).Numerator,(ulong)(uint)(PDesc->SampleRate).Denominator,
          (ulong)PDesc->StoredWidth,(ulong)PDesc->StoredHeight,(ulong)PDesc->Rsize,
          (ulong)PDesc->Xsize,(ulong)PDesc->Ysize,(ulong)PDesc->XOsize,(ulong)PDesc->YOsize,
          (ulong)PDesc->XTsize,(ulong)PDesc->YTsize,(ulong)PDesc->XTOsize,(ulong)PDesc->YTOsize,
          (ulong)PDesc->ContainerDuration);
  fwrite("-- JPEG 2000 Metadata --\n",0x19,1,(FILE *)stream);
  fwrite("    ImageComponents:\n",0x15,1,(FILE *)stream);
  fwrite("  bits  h-sep v-sep\n",0x14,1,(FILE *)stream);
  if (PDesc->Csize != 0) {
    puVar10 = &PDesc->ImageComponents[0].YRsize;
    uVar7 = 0;
    do {
      fprintf((FILE *)stream,"  %4d  %5d %5d\n",
              (ulong)(((ImageComponent_t *)(puVar10 + -2))->Ssize + 1),(ulong)puVar10[-1],
              (ulong)*puVar10);
      if (1 < uVar7) break;
      uVar7 = uVar7 + 1;
      puVar10 = puVar10 + 3;
    } while (uVar7 < PDesc->Csize);
  }
  fprintf((FILE *)stream,"               Scod: %hhu\n",(ulong)(PDesc->CodingStyleDefault).Scod);
  fprintf((FILE *)stream,"   ProgressionOrder: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SGcod.ProgressionOrder);
  uVar3 = *(ushort *)(PDesc->CodingStyleDefault).SGcod.NumberOfLayers;
  fprintf((FILE *)stream,"     NumberOfLayers: %hd\n",(ulong)(ushort)(uVar3 << 8 | uVar3 >> 8));
  fprintf((FILE *)stream," MultiCompTransform: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SGcod.MultiCompTransform);
  fprintf((FILE *)stream,"DecompositionLevels: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.DecompositionLevels);
  fprintf((FILE *)stream,"     CodeblockWidth: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.CodeblockWidth);
  fprintf((FILE *)stream,"    CodeblockHeight: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.CodeblockHeight);
  fprintf((FILE *)stream,"     CodeblockStyle: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.CodeblockStyle);
  fprintf((FILE *)stream,"     Transformation: %hhu\n",
          (ulong)(PDesc->CodingStyleDefault).SPcod.Transformation);
  if ((PDesc->CodingStyleDefault).SPcod.PrecinctSize[0] != '\0') {
    uVar7 = 0;
    do {
      uVar8 = uVar7 + 1;
      if (0x1e < uVar7) break;
      lVar6 = uVar7 + 1;
      uVar7 = uVar8;
    } while ((PDesc->CodingStyleDefault).SPcod.PrecinctSize[lVar6] != '\0');
  }
  fprintf((FILE *)stream,"          Precincts: %u\n",uVar8 & 0xffffffff);
  fwrite("precinct dimensions:\n",0x15,1,(FILE *)stream);
  if ((int)uVar8 != 0) {
    uVar7 = 0;
    do {
      bVar2 = (PDesc->CodingStyleDefault).SPcod.PrecinctSize[uVar7];
      uVar7 = uVar7 + 1;
      fprintf((FILE *)stream,"    %d: %d x %d\n",uVar7 & 0xffffffff,
              (ulong)(uint)s_exp_lookup[bVar2 & 0xf],(ulong)(uint)s_exp_lookup[bVar2 >> 4]);
    } while ((uVar8 & 0xffffffff) != uVar7);
  }
  fprintf((FILE *)stream,"               Sqcd: %hhu\n",(ulong)(PDesc->QuantizationDefault).Sqcd);
  uVar5 = Kumu::bin2hex((PDesc->QuantizationDefault).SPqcd,
                        (uint)(PDesc->QuantizationDefault).SPqcdLength,tmp_buf,0x200);
  fprintf((FILE *)stream,"              SPqcd: %s\n",uVar5);
  if ((PDesc->Profile).N != 0) {
    fwrite("               Profile:\n",0x18,1,(FILE *)stream);
    if ((PDesc->Profile).N != 0) {
      uVar8 = 0;
      do {
        puVar1 = (PDesc->Profile).Pprf + uVar8;
        uVar8 = uVar8 + 1;
        fprintf((FILE *)stream,"              Pprf(%d): %hx\n",uVar8 & 0xffffffff,(ulong)*puVar1);
      } while (uVar8 < (PDesc->Profile).N);
    }
  }
  if ((PDesc->CorrespondingProfile).N != 0) {
    fwrite("Corresponding Profile:\n",0x17,1,(FILE *)stream);
    if ((PDesc->CorrespondingProfile).N != 0) {
      uVar8 = 0;
      do {
        puVar1 = (PDesc->CorrespondingProfile).Pcpf + uVar8;
        uVar8 = uVar8 + 1;
        fprintf((FILE *)stream,"              Pcpf(%d): %hx\n",uVar8 & 0xffffffff,(ulong)*puVar1);
      } while (uVar8 < (PDesc->CorrespondingProfile).N);
    }
  }
  if ((PDesc->ExtendedCapabilities).N != -1) {
    fprintf((FILE *)stream,"Extended Capabilities: %x\n",(ulong)(PDesc->ExtendedCapabilities).Pcap);
    cVar4 = (PDesc->ExtendedCapabilities).N;
    if ('\0' < cVar4) {
      uVar11 = 1;
      iVar9 = 0;
      do {
        if (((PDesc->ExtendedCapabilities).Pcap << ((byte)(uVar11 - 1) & 0x1f) & 0x80000000) != 0) {
          lVar6 = (long)iVar9;
          iVar9 = iVar9 + 1;
          fprintf((FILE *)stream,"           Ccap(%d): %hx\n",(ulong)uVar11,
                  (ulong)(PDesc->ExtendedCapabilities).Ccap[lVar6]);
          cVar4 = (PDesc->ExtendedCapabilities).N;
        }
      } while ((uVar11 - 1 < 0x1f) && (uVar11 = uVar11 + 1, iVar9 < cVar4));
    }
  }
  return;
}

Assistant:

void
ASDCP::JP2K::PictureDescriptorDump(const PictureDescriptor& PDesc, FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  fprintf(stream, "\
       AspectRatio: %d/%d\n\
          EditRate: %d/%d\n\
        SampleRate: %d/%d\n\
       StoredWidth: %u\n\
      StoredHeight: %u\n\
             Rsize: %u\n\
             Xsize: %u\n\
             Ysize: %u\n\
            XOsize: %u\n\
            YOsize: %u\n\
            XTsize: %u\n\
            YTsize: %u\n\
           XTOsize: %u\n\
           YTOsize: %u\n\
 ContainerDuration: %u\n",
	  PDesc.AspectRatio.Numerator, PDesc.AspectRatio.Denominator,
	  PDesc.EditRate.Numerator, PDesc.EditRate.Denominator,
	  PDesc.SampleRate.Numerator, PDesc.SampleRate.Denominator,
	  PDesc.StoredWidth,
	  PDesc.StoredHeight,
	  PDesc.Rsize,
	  PDesc.Xsize,
	  PDesc.Ysize,
	  PDesc.XOsize,
	  PDesc.YOsize,
	  PDesc.XTsize,
	  PDesc.YTsize,
	  PDesc.XTOsize,
	  PDesc.YTOsize,
	  PDesc.ContainerDuration
	  );

  fprintf(stream, "-- JPEG 2000 Metadata --\n");
  fprintf(stream, "    ImageComponents:\n");
  fprintf(stream, "  bits  h-sep v-sep\n");

  ui32_t i;
  for ( i = 0; i < PDesc.Csize && i < MaxComponents; i++ )
    {
      fprintf(stream, "  %4d  %5d %5d\n",
	      PDesc.ImageComponents[i].Ssize + 1, // See ISO 15444-1, Table A11, for the origin of '+1'
	      PDesc.ImageComponents[i].XRsize,
	      PDesc.ImageComponents[i].YRsize
	      );
    }
  
  fprintf(stream, "               Scod: %hhu\n", PDesc.CodingStyleDefault.Scod);
  fprintf(stream, "   ProgressionOrder: %hhu\n", PDesc.CodingStyleDefault.SGcod.ProgressionOrder);
  fprintf(stream, "     NumberOfLayers: %hd\n",
	  KM_i16_BE(Kumu::cp2i<ui16_t>(PDesc.CodingStyleDefault.SGcod.NumberOfLayers)));

  fprintf(stream, " MultiCompTransform: %hhu\n", PDesc.CodingStyleDefault.SGcod.MultiCompTransform);
  fprintf(stream, "DecompositionLevels: %hhu\n", PDesc.CodingStyleDefault.SPcod.DecompositionLevels);
  fprintf(stream, "     CodeblockWidth: %hhu\n", PDesc.CodingStyleDefault.SPcod.CodeblockWidth);
  fprintf(stream, "    CodeblockHeight: %hhu\n", PDesc.CodingStyleDefault.SPcod.CodeblockHeight);
  fprintf(stream, "     CodeblockStyle: %hhu\n", PDesc.CodingStyleDefault.SPcod.CodeblockStyle);
  fprintf(stream, "     Transformation: %hhu\n", PDesc.CodingStyleDefault.SPcod.Transformation);


  ui32_t precinct_set_size = 0;

  for ( i = 0; PDesc.CodingStyleDefault.SPcod.PrecinctSize[i] != 0 && i < MaxPrecincts; ++i )
    precinct_set_size++;

  fprintf(stream, "          Precincts: %u\n", precinct_set_size);
  fprintf(stream, "precinct dimensions:\n");

  for ( i = 0; i < precinct_set_size && i < MaxPrecincts; i++ )
    fprintf(stream, "    %d: %d x %d\n", i + 1,
	    s_exp_lookup[PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]&0x0f],
	    s_exp_lookup[(PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]>>4)&0x0f]
	    );

  fprintf(stream, "               Sqcd: %hhu\n", PDesc.QuantizationDefault.Sqcd);

  char tmp_buf[MaxDefaults*2];
  fprintf(stream, "              SPqcd: %s\n",
	  Kumu::bin2hex(PDesc.QuantizationDefault.SPqcd, PDesc.QuantizationDefault.SPqcdLength,
			tmp_buf, MaxDefaults*2)
	  );


  if (PDesc.Profile.N != 0) {
	  fprintf(stream, "               Profile:\n");

	  for (ui16_t i = 0; i < PDesc.Profile.N; i++) {

		  fprintf(stream, "              Pprf(%d): %hx\n", i + 1, PDesc.Profile.Pprf[i]);

	  }
  }

  if (PDesc.CorrespondingProfile.N != 0) {
	  fprintf(stream, "Corresponding Profile:\n");

	  for (ui16_t i = 0; i < PDesc.CorrespondingProfile.N; i++) {
		  fprintf(stream, "              Pcpf(%d): %hx\n", i + 1, PDesc.CorrespondingProfile.Pcpf[i]);

	  }
  }

  if (PDesc.ExtendedCapabilities.N != JP2K::NoExtendedCapabilitiesSignaled) {

	  fprintf(stream, "Extended Capabilities: %x\n", PDesc.ExtendedCapabilities.Pcap);

	  for (i32_t b = 0, i = 0; b < JP2K::MaxCapabilities && i < PDesc.ExtendedCapabilities.N; b++) {

		  if ((PDesc.ExtendedCapabilities.Pcap >> (JP2K::MaxCapabilities - b - 1)) & 0x1) {

			  fprintf(stream, "           Ccap(%d): %hx\n", b + 1, PDesc.ExtendedCapabilities.Ccap[i++]);

		  }
	  }

  }
  
}